

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

int16_t * __thiscall
sptk::reaper::EpochTracker::HighpassFilter
          (EpochTracker *this,int16_t *input,int32_t n_input,float sample_rate,float corner_freq,
          float fir_duration)

{
  bool bVar1;
  int nIn;
  bool first;
  int iVar2;
  int iVar3;
  int16_t *piVar4;
  bool last;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int32_t iVar8;
  FdFilter filter;
  FdFilter local_c0;
  
  FdFilter::FdFilter(&local_c0,sample_rate,corner_freq,true,fir_duration,false);
  uVar5 = 0xffffffffffffffff;
  if (-1 < n_input) {
    uVar5 = (long)n_input * 2;
  }
  piVar4 = (int16_t *)operator_new__(uVar5);
  iVar2 = FdFilter::GetMaxInputSize(&local_c0);
  if (0 < n_input) {
    first = true;
    iVar6 = 0;
    iVar7 = 0;
    last = false;
    iVar8 = n_input;
    do {
      if (iVar8 <= iVar2) {
        last = true;
      }
      nIn = iVar2;
      if (iVar8 < iVar2) {
        nIn = iVar8;
      }
      iVar3 = FdFilter::FilterArray
                        (&local_c0,input + iVar7,nIn,first,last,piVar4 + iVar6,n_input - iVar6);
      iVar7 = iVar7 + nIn;
      iVar6 = iVar6 + iVar3;
      first = false;
      iVar3 = iVar8 - nIn;
      bVar1 = nIn <= iVar8;
      iVar8 = iVar3;
    } while (iVar3 != 0 && bVar1);
  }
  FdFilter::~FdFilter(&local_c0);
  return piVar4;
}

Assistant:

int16_t* EpochTracker::HighpassFilter(int16_t* input, int32_t n_input,
                                      float sample_rate, float corner_freq,
				      float fir_duration) {
  FdFilter filter(sample_rate, corner_freq, true, fir_duration, false);
  int16_t* filtered_data = new int16_t[n_input];
  int32_t max_buffer_size = filter.GetMaxInputSize();
  int32_t to_process = n_input;
  bool start = true;
  bool end = false;
  int32_t input_index = 0;
  int32_t output_index = 0;
  while (to_process > 0) {
    int32_t to_send = to_process;
    if (to_send > max_buffer_size) {
      to_send = max_buffer_size;
    } else {
      end = true;
    }
    int32_t samples_returned = filter.FilterArray(input + input_index, to_send,
                                                  start, end,
                                                  filtered_data + output_index,
                                                  n_input - output_index);
    input_index += to_send;
    to_process -= to_send;
    output_index += samples_returned;
    start = false;
  }
  return filtered_data;
}